

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_call_on_header(nghttp2_session *session,nghttp2_frame *frame,nghttp2_hd_nv *nv)

{
  int local_2c;
  int rv;
  nghttp2_hd_nv *nv_local;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  local_2c = 0;
  if ((session->callbacks).on_header_callback2 == (nghttp2_on_header_callback2)0x0) {
    if ((session->callbacks).on_header_callback != (nghttp2_on_header_callback)0x0) {
      local_2c = (*(session->callbacks).on_header_callback)
                           (session,frame,nv->name->base,nv->name->len,nv->value->base,
                            nv->value->len,nv->flags,session->user_data);
    }
  }
  else {
    local_2c = (*(session->callbacks).on_header_callback2)
                         (session,frame,nv->name,nv->value,nv->flags,session->user_data);
  }
  if ((local_2c == -0x20e) || (local_2c == -0x209)) {
    session_local._4_4_ = local_2c;
  }
  else if (local_2c == 0) {
    session_local._4_4_ = 0;
  }
  else {
    session_local._4_4_ = -0x386;
  }
  return session_local._4_4_;
}

Assistant:

static int session_call_on_header(nghttp2_session *session,
                                  const nghttp2_frame *frame,
                                  const nghttp2_hd_nv *nv) {
  int rv = 0;
  if (session->callbacks.on_header_callback2) {
    rv = session->callbacks.on_header_callback2(
        session, frame, nv->name, nv->value, nv->flags, session->user_data);
  } else if (session->callbacks.on_header_callback) {
    rv = session->callbacks.on_header_callback(
        session, frame, nv->name->base, nv->name->len, nv->value->base,
        nv->value->len, nv->flags, session->user_data);
  }

  if (rv == NGHTTP2_ERR_PAUSE || rv == NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE) {
    return rv;
  }
  if (rv != 0) {
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  return 0;
}